

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

learner<OjaNewton,_example> *
LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
          (free_ptr<OjaNewton> *dat,
          _func_void_OjaNewton_ptr_learner<char,_char>_ptr_example_ptr *learn,
          _func_void_OjaNewton_ptr_learner<char,_char>_ptr_example_ptr *predict,
          size_t params_per_weight)

{
  learner<OjaNewton,_example> *plVar1;
  
  plVar1 = learner<OjaNewton,example>::init_learner<LEARNER::learner<char,char>>
                     ((dat->_M_t).super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl,
                      (learner<char,_char> *)0x0,learn,predict,params_per_weight,scalar);
  (dat->_M_t).super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>.
  _M_head_impl = (OjaNewton *)0x0;
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}